

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * Kvm::loadProc(Kvm *vm,Value *args)

{
  Value *v;
  Value *pVVar1;
  KatException *this;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  allocator<char> local_241;
  string msg;
  ifstream in;
  byte abStack_207 [7];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&in,(char *)args[1]._vptr_Value[3],_S_in);
  if ((abStack_200[*(long *)(_in + -0x18)] & 5) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"could not load file \"",&local_241);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::string::append((char *)&msg);
    this = (KatException *)__cxa_allocate_exception(0x10);
    anon_unknown.dwarf_e6eb::KatException::KatException(this,&msg);
    __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  abStack_207[*(long *)(_in + -0x18)] = abStack_207[*(long *)(_in + -0x18)] & 0xef;
  pVVar1 = (Value *)0x0;
  __buf = extraout_RDX;
  do {
    v = (Value *)read(vm,(int)&in,__buf,in_RCX);
    if ((v == (Value *)0x0) || (in_RCX = *(size_t *)(_in + -0x18), (abStack_200[in_RCX] & 5) != 0))
    goto LAB_0010a73a;
    pVVar1 = eval(vm,v,vm->GLOBAL_ENV);
    __buf = extraout_RDX_00;
  } while (pVVar1 != (Value *)0x0);
  pVVar1 = (Value *)0x0;
LAB_0010a73a:
  std::ifstream::~ifstream(&in);
  return pVVar1;
}

Assistant:

const Value* Kvm::loadProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;

    std::ifstream in(filename);

    if (!in)
    {
        std::string msg("could not load file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }

    const Value *v = nullptr;
    const Value *result = nullptr;

    in.unsetf(std::ios_base::skipws);
    while ((v = vm->read(in)) && in)
    {
        result = vm->eval(v, vm->GLOBAL_ENV);
        if (!result) return nullptr;
    }
    return result;
}